

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,char *attribute)

{
  char *pcVar1;
  ulong uVar2;
  ostream *poVar3;
  allocator local_69;
  string local_68 [32];
  XmlEncode local_48;
  char *local_20;
  char *attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  local_20 = attribute;
  attribute_local = (char *)name;
  name_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((((uVar2 & 1) == 0) && (local_20 != (char *)0x0)) && (*local_20 != '\0')) {
    poVar3 = std::operator<<(this->m_os,' ');
    poVar3 = std::operator<<(poVar3,(string *)attribute_local);
    poVar3 = std::operator<<(poVar3,"=\"");
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    XmlEncode::XmlEncode(&local_48,(string *)local_68,ForAttributes);
    poVar3 = anon_unknown_14::operator<<(poVar3,&local_48);
    std::operator<<(poVar3,'\"');
    XmlEncode::~XmlEncode(&local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, const char* attribute ) {
        if( !name.empty() && attribute && attribute[0] != '\0' )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }